

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::DefaultPrintTo<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
               (undefined8 param_1,long *param_2,ostream *param_3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  wchar_t *value;
  
  std::__ostream_insert<char,std::char_traits<char>>(param_3,"{",1);
  lVar1 = *param_2;
  if (lVar1 != 0) {
    value = (wchar_t *)param_2[1];
    lVar2 = lVar1 * 4;
    lVar3 = 0x20;
    do {
      if ((lVar3 != 0x20) &&
         (std::__ostream_insert<char,std::char_traits<char>>(param_3,",",1), lVar3 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(param_3," ...",4);
        goto LAB_001f234c;
      }
      std::__ostream_insert<char,std::char_traits<char>>(param_3," ",1);
      iuUniversalPrinter<wchar_t>::Print(value,param_3);
      value = value + 1;
      lVar3 = lVar3 + -1;
      lVar2 = lVar2 + -4;
    } while (lVar2 != 0);
    if (lVar1 != 0) {
LAB_001f234c:
      std::__ostream_insert<char,std::char_traits<char>>(param_3," ",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(param_3,"}",1);
  return;
}

Assistant:

inline void DefaultPrintTo(IsContainerHelper::yes_t
                           , iutest_type_traits::false_type
                           , const T& container, iu_ostream* os)
{
    const size_t kMaxCount = kValues::MaxPrintContainerCount;
    size_t count = 0;
    *os << "{";
    for( typename T::const_iterator it=container.begin(), end=container.end(); it != end; ++it, ++count)
    {
        if( count > 0 )
        {
            *os << ",";
            if( count == kMaxCount )
            {
                *os << " ...";
                break;
            }
        }
        *os << " ";
        UniversalPrint(*it, os);
    }
    if( count > 0 )
    {
        *os << " ";
    }
    *os << "}";
}